

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

Type __thiscall miniscript::Node<XOnlyPubKey>::CalcType(Node<XOnlyPubKey> *this)

{
  long lVar1;
  pointer psVar2;
  Type TVar3;
  ulong n_subs;
  Type y;
  Type x;
  shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *sub;
  pointer psVar4;
  long in_FS_OFFSET;
  Type local_4c;
  vector<miniscript::Type,_std::allocator<miniscript::Type>_> sub_types;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sub_types.super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sub_types.super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sub_types.super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->fragment == THRESH) {
    psVar4 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar4 != psVar2) {
      do {
        local_4c.m_flags =
             (((psVar4->
               super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->typ).m_flags;
        if (sub_types.super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            sub_types.super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<miniscript::Type,_std::allocator<miniscript::Type>_>::
          _M_realloc_insert<miniscript::Type>
                    (&sub_types,
                     (iterator)
                     sub_types.
                     super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>._M_impl
                     .super__Vector_impl_data._M_finish,&local_4c);
        }
        else {
          (sub_types.super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>._M_impl
           .super__Vector_impl_data._M_finish)->m_flags = (uint32_t)local_4c;
          sub_types.super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>._M_impl.
          super__Vector_impl_data._M_finish =
               sub_types.super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        psVar4 = psVar4 + 1;
      } while (psVar4 != psVar2);
    }
  }
  psVar4 = (this->subs).
           super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->subs).
           super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  n_subs = (long)psVar2 - (long)psVar4 >> 4;
  TVar3.m_flags = 0;
  if (psVar2 == psVar4) {
    y.m_flags = 0;
    x.m_flags = 0;
  }
  else {
    x.m_flags = (((psVar4->
                  super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->typ).m_flags;
    if (n_subs < 2) {
      y.m_flags = 0;
    }
    else {
      y.m_flags = ((psVar4[1].
                    super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->typ).m_flags;
      TVar3.m_flags = 0;
      if ((long)psVar2 - (long)psVar4 != 0x20) {
        TVar3.m_flags =
             ((psVar4[2].
               super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->typ).m_flags;
      }
    }
  }
  TVar3 = internal::ComputeType
                    (this->fragment,x,y,TVar3,&sub_types,this->k,
                     (long)(this->data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(this->data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,n_subs,
                     (long)(this->keys).
                           super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->keys).
                           super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
                           super__Vector_impl_data._M_start >> 5,this->m_script_ctx);
  TVar3 = internal::SanitizeType(TVar3);
  if (sub_types.super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sub_types.
                    super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)sub_types.
                          super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)sub_types.
                          super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Type)TVar3.m_flags;
  }
  __stack_chk_fail();
}

Assistant:

Type CalcType() const {
        using namespace internal;

        // THRESH has a variable number of subexpressions
        std::vector<Type> sub_types;
        if (fragment == Fragment::THRESH) {
            for (const auto& sub : subs) sub_types.push_back(sub->GetType());
        }
        // All other nodes than THRESH can be computed just from the types of the 0-3 subexpressions.
        static constexpr auto NONE_MST{""_mst};
        Type x = subs.size() > 0 ? subs[0]->GetType() : NONE_MST;
        Type y = subs.size() > 1 ? subs[1]->GetType() : NONE_MST;
        Type z = subs.size() > 2 ? subs[2]->GetType() : NONE_MST;

        return SanitizeType(ComputeType(fragment, x, y, z, sub_types, k, data.size(), subs.size(), keys.size(), m_script_ctx));
    }